

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * duckdb_fmt::v6::internal::
          parse_align<wchar_t,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  char cVar1;
  wchar_t wVar2;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *this;
  basic_format_specs<wchar_t> *pbVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  byte bVar7;
  wchar_t *pwVar8;
  size_type __dnew;
  string local_78;
  string local_58;
  size_type local_38;
  
  pwVar8 = begin + 1;
  uVar5 = (ulong)(pwVar8 != end);
  do {
    cVar1 = (char)begin[uVar5];
    bVar6 = true;
    bVar4 = false;
    if (cVar1 < '>') {
      if (cVar1 == '<') {
        bVar7 = 1;
        goto LAB_01cb89e9;
      }
      bVar7 = 0;
      bVar4 = false;
      if (cVar1 == '=') {
        bVar7 = 4;
        bVar4 = true;
        bVar6 = false;
      }
    }
    else {
      if (cVar1 == '>') {
        bVar7 = 2;
      }
      else {
        bVar7 = 0;
        if (cVar1 != '^') goto LAB_01cb89ee;
        bVar7 = 3;
      }
LAB_01cb89e9:
      bVar6 = false;
      bVar4 = false;
    }
LAB_01cb89ee:
    if (!bVar6) {
      if (0 < (long)uVar5) {
        wVar2 = *begin;
        if (wVar2 == L'{') {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"invalid fill character \'{\'","");
          specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_error(&handler->
                      super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                     ,&local_78);
          pwVar8 = begin;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
        }
        else {
          pwVar8 = begin + 2;
          (((handler->
            super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            ).super_specs_setter<wchar_t>.specs_)->fill).data_[0] = wVar2;
        }
        if (wVar2 == L'{') {
          return begin;
        }
      }
      if ((bVar4) && (0xb < (handler->checker_).arg_type_ - named_arg_type)) {
        this = (handler->checker_).error_handler_;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_38 = 0x2a;
        local_58._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
        local_58.field_2._M_allocated_capacity = local_38;
        builtin_strncpy(local_58._M_dataplus._M_p,"format specifier requires numeric argument",0x2a)
        ;
        local_58._M_string_length = local_38;
        local_58._M_dataplus._M_p[local_38] = '\0';
        specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_error(this,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      pbVar3 = (handler->
               super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
               ).super_specs_setter<wchar_t>.specs_;
      pbVar3->field_0x9 = pbVar3->field_0x9 & 0xf0 | bVar7;
      return pwVar8;
    }
    bVar4 = (long)uVar5 < 1;
    uVar5 = uVar5 - 1;
    if (bVar4) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}